

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O2

void __thiscall
wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::ModuleUtils::(anonymous_namespace)::Counts,(wasm::
Mutability)0,wasm::InsertOrderedMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm
::Function*,wasm::ModuleUtils::(anonymous_namespace)::Counts&)>)::Mapper::Mapper(wasm::Module&,wasm
::InsertOrderedMap<wasm::Function*,wasm::ModuleUtils::(anonymous_namespace)::Counts>&,std::
function<void(wasm::Function*,wasm::ModuleUtils::(anonymous)::Counts__>_
          (void *this,Module *module,Map *map,Func *work)

{
  *(undefined8 *)((long)this + 8) = 0;
  *(long *)((long)this + 0x10) = (long)this + 0x20;
  *(undefined8 *)((long)this + 0x18) = 0;
  *(undefined1 *)((long)this + 0x20) = 0;
  *(undefined8 *)((long)this + 0x30) = 0;
  *(undefined8 *)((long)this + 0x38) = 0;
  *(undefined8 *)((long)this + 0xe0) = 0;
  *(undefined8 *)((long)this + 0xe8) = 0;
  *(undefined8 *)((long)this + 0xf0) = 0;
  *(undefined8 *)((long)this + 0xf8) = 0;
  *(undefined8 *)((long)this + 0x100) = 0;
  *(undefined ***)this = &PTR__Mapper_00e22210;
  *(Module **)((long)this + 0x108) = module;
  *(Map **)((long)this + 0x110) = map;
  std::function<void_(wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts_&)>::
  function((function<void_(wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts_&)> *)
           ((long)this + 0x118),
           (function<void_(wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts_&)> *)
           work);
  return;
}

Assistant:

Mapper(Module& module, Map& map, Func work)
        : module(module), map(map), work(work) {}